

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,QualifiedIdentifier *qi)

{
  vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
  *this_00;
  size_t *psVar1;
  Context *this_01;
  Scope *this_02;
  pointer pPVar2;
  ASTObject *pAVar3;
  Allocator *pAVar4;
  bool bVar5;
  Namespace *pNVar6;
  pool_ref<soul::AST::ASTObject> *ppVar7;
  StructDeclaration *args_1;
  VariableDeclaration *args_1_00;
  ProcessorBase *pPVar8;
  NamespaceAliasDeclaration *pNVar9;
  ProcessorInstance *args_1_01;
  ProcessorAliasDeclaration *pPVar10;
  EndpointDeclaration *pEVar11;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *this_03;
  pool_ptr<soul::AST::Namespace> targetNamespace;
  pool_ptr<soul::AST::StructDeclaration> s;
  ResolutionPass *local_350;
  int itemsRemoved;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> specialisationArgs;
  pool_ptr<soul::AST::Expression> local_2a0;
  pool_ref<soul::AST::ASTObject> local_298;
  pool_ref<soul::AST::ASTObject> local_290;
  pool_ptr<soul::AST::Expression> local_288;
  pool_ref<soul::AST::ASTObject> local_280;
  pool_ref<soul::AST::ASTObject> local_278;
  pool_ref<soul::AST::ASTObject> local_270;
  pool_ref<soul::AST::ASTObject> local_268;
  pool_ptr<soul::AST::Expression> local_260;
  pool_ptr<soul::AST::Expression> local_258;
  pool_ref<soul::AST::ASTObject> local_250;
  pool_ref<soul::AST::ASTObject> local_248;
  pool_ref<soul::AST::ASTObject> local_240;
  pool_ref<soul::AST::ASTObject> local_238;
  pool_ptr<soul::AST::Expression> local_230;
  string path;
  NameSearch local_208;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  RewritingASTVisitor::visit((RewritingASTVisitor *)this,qi);
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&local_208,qi);
  IdentifierPath::toString_abi_cxx11_(&path,(IdentifierPath *)&local_208);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&local_208);
  local_208.itemsFound.items = (pool_ref<soul::AST::ASTObject> *)local_208.itemsFound.space;
  local_208.itemsFound.numActive = 0;
  local_208.itemsFound.numAllocated = 8;
  local_208.partiallyQualifiedPath.pathSections.items =
       (Identifier *)local_208.partiallyQualifiedPath.pathSections.space;
  local_208.partiallyQualifiedPath.pathSections.numActive = 0;
  local_208.partiallyQualifiedPath.pathSections.numAllocated = 8;
  local_208.stopAtFirstScopeWithResults = false;
  local_208.requiredNumFunctionArgs = -1;
  local_208.findVariables = true;
  local_208.findTypes = true;
  local_208.findFunctions = true;
  local_208.findNamespaces = true;
  local_208.findProcessors = true;
  local_208.findProcessorInstances = false;
  local_208.findEndpoints = true;
  local_208.onlyFindLocalVariables = false;
  AST::QualifiedIdentifier::getPath((IdentifierPath *)&s,qi);
  ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
            (&local_208.partiallyQualifiedPath.pathSections,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)&s);
  ArrayWithPreallocation<soul::Identifier,_8UL>::clear
            ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&s);
  local_208.stopAtFirstScopeWithResults = true;
  local_208._184_4_ = 0x1000101;
  local_208.findProcessors = true;
  local_208.findEndpoints = true;
  local_208.findProcessorInstances = this->parsingProcessorInstance == 0;
  this_02 = (qi->super_Expression).super_Statement.super_ASTObject.context.parentScope;
  if (this_02 != (Scope *)0x0) {
    AST::Scope::performFullNameSearch(this_02,&local_208,(this->currentStatement).object);
  }
  if (local_208.itemsFound.numActive == 1) {
    ppVar7 = ArrayWithPreallocation<soul::pool_ref<soul::AST::ASTObject>,_8UL>::front
                       (&local_208.itemsFound);
    pAVar3 = ppVar7->object;
    this_00 = &qi->pathSections;
    pPVar2 = (qi->pathSections).
             super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (((long)(qi->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar2 == 0x60) &&
       ((pPVar2->specialisationArgs).object == (Expression *)0x0)) {
      local_238.object = pAVar3;
      cast<soul::AST::StructDeclaration,soul::AST::ASTObject>((soul *)&s,&local_238);
      if (s.object != (StructDeclaration *)0x0) {
        pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator;
        args_1 = pool_ptr<soul::AST::StructDeclaration>::operator*(&s);
        qi = (QualifiedIdentifier *)
             PoolAllocator::
             allocate<soul::AST::StructDeclarationRef,soul::AST::Context&,soul::AST::StructDeclaration&>
                       (&pAVar4->pool,
                        &(qi->super_Expression).super_Statement.super_ASTObject.context,args_1);
        goto LAB_0023e771;
      }
      local_240.object = pAVar3;
      cast<soul::AST::Expression,soul::AST::ASTObject>((soul *)&s,&local_240);
      if (s.object != (StructDeclaration *)0x0) {
        qi = (QualifiedIdentifier *)
             pool_ptr<soul::AST::Expression>::operator*((pool_ptr<soul::AST::Expression> *)&s);
        goto LAB_0023e771;
      }
      local_248.object = pAVar3;
      cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>((soul *)&s,&local_248);
      if (s.object != (StructDeclaration *)0x0) {
        this->numVariablesResolved = this->numVariablesResolved + 1;
        pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator;
        args_1_00 = pool_ptr<soul::AST::VariableDeclaration>::operator*
                              ((pool_ptr<soul::AST::VariableDeclaration> *)&s);
        qi = (QualifiedIdentifier *)
             PoolAllocator::
             allocate<soul::AST::VariableRef,soul::AST::Context&,soul::AST::VariableDeclaration&>
                       (&pAVar4->pool,
                        &(qi->super_Expression).super_Statement.super_ASTObject.context,args_1_00);
        goto LAB_0023e771;
      }
      local_250.object = pAVar3;
      cast<soul::AST::ProcessorBase,soul::AST::ASTObject>((soul *)&specialisationArgs,&local_250);
      if (specialisationArgs.items == (pool_ref<soul::AST::Expression> *)0x0) {
        local_268.object = pAVar3;
        cast<soul::AST::Namespace,soul::AST::ASTObject>((soul *)&s,&local_268);
        if (s.object != (StructDeclaration *)0x0) {
          pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                   allocator;
          pNVar6 = pool_ptr<soul::AST::Namespace>::operator*((pool_ptr<soul::AST::Namespace> *)&s);
          qi = (QualifiedIdentifier *)
               PoolAllocator::
               allocate<soul::AST::NamespaceRef,soul::AST::Context&,soul::AST::Namespace&>
                         (&pAVar4->pool,
                          &(qi->super_Expression).super_Statement.super_ASTObject.context,pNVar6);
          goto LAB_0023e771;
        }
        local_270.object = pAVar3;
        cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>
                  ((soul *)&specialisationArgs,&local_270);
        if (specialisationArgs.items != (pool_ref<soul::AST::Expression> *)0x0) {
          pNVar9 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->
                             ((pool_ptr<soul::AST::NamespaceAliasDeclaration> *)&specialisationArgs)
          ;
          if ((pNVar9->resolvedNamespace).object != (Namespace *)0x0) {
            pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            pNVar9 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->
                               ((pool_ptr<soul::AST::NamespaceAliasDeclaration> *)
                                &specialisationArgs);
            pNVar6 = pool_ptr<soul::AST::Namespace>::operator*(&pNVar9->resolvedNamespace);
            qi = (QualifiedIdentifier *)
                 PoolAllocator::
                 allocate<soul::AST::NamespaceRef,soul::AST::Context&,soul::AST::Namespace&>
                           (&pAVar4->pool,
                            &(qi->super_Expression).super_Statement.super_ASTObject.context,pNVar6);
            goto LAB_0023e771;
          }
          pNVar9 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->
                             ((pool_ptr<soul::AST::NamespaceAliasDeclaration> *)&specialisationArgs)
          ;
          if ((QualifiedIdentifier *)(pNVar9->targetNamespace).object == qi) {
            AST::QualifiedIdentifier::getPath((IdentifierPath *)&s,qi);
            Errors::circularNamespaceAlias<soul::IdentifierPath>(&local_a0,(IdentifierPath *)&s);
            AST::Context::throwError
                      (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_a0,
                       false);
          }
        }
        local_278.object = pAVar3;
        cast<soul::AST::ProcessorInstance,soul::AST::ASTObject>((soul *)&s,&local_278);
        if (s.object != (StructDeclaration *)0x0) {
          pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                   allocator;
          args_1_01 = pool_ptr<soul::AST::ProcessorInstance>::operator*
                                ((pool_ptr<soul::AST::ProcessorInstance> *)&s);
          qi = (QualifiedIdentifier *)
               PoolAllocator::
               allocate<soul::AST::ProcessorInstanceRef,soul::AST::Context&,soul::AST::ProcessorInstance&>
                         (&pAVar4->pool,
                          &(qi->super_Expression).super_Statement.super_ASTObject.context,args_1_01)
          ;
          goto LAB_0023e771;
        }
        local_280.object = pAVar3;
        cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>((soul *)&s,&local_280);
        if ((s.object != (StructDeclaration *)0x0) &&
           (pPVar10 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->
                                ((pool_ptr<soul::AST::ProcessorAliasDeclaration> *)&s),
           (pPVar10->resolvedProcessor).object != (ProcessorBase *)0x0)) {
          if ((this->currentConnectionEndpoint).object == (SharedEndpoint *)0x0) {
            pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                     allocator;
            pPVar10 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->
                                ((pool_ptr<soul::AST::ProcessorAliasDeclaration> *)&s);
            pPVar8 = pool_ptr<soul::AST::ProcessorBase>::operator*(&pPVar10->resolvedProcessor);
            qi = (QualifiedIdentifier *)
                 PoolAllocator::
                 allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                           (&pAVar4->pool,
                            &(qi->super_Expression).super_Statement.super_ASTObject.context,pPVar8);
          }
          else {
            pPVar10 = pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->
                                ((pool_ptr<soul::AST::ProcessorAliasDeclaration> *)&s);
            pPVar8 = pool_ptr<soul::AST::ProcessorBase>::operator*(&pPVar10->resolvedProcessor);
            local_288.object = (Expression *)0x0;
            qi = (QualifiedIdentifier *)
                 getOrCreateImplicitProcessorInstance
                           (this,&(qi->super_Expression).super_Statement.super_ASTObject.context,
                            pPVar8,&local_288);
          }
          goto LAB_0023e771;
        }
        local_290.object = pAVar3;
        cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>((soul *)&s,&local_290);
        if ((s.object != (StructDeclaration *)0x0) &&
           (pEVar11 = pool_ptr<soul::AST::EndpointDeclaration>::operator->
                                ((pool_ptr<soul::AST::EndpointDeclaration> *)&s),
           (pEVar11->details).object != (EndpointDetails *)0x0)) {
          pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                   allocator;
          pEVar11 = pool_ptr<soul::AST::EndpointDeclaration>::operator*
                              ((pool_ptr<soul::AST::EndpointDeclaration> *)&s);
          qi = (QualifiedIdentifier *)
               ASTUtilities::createEndpointRef
                         (pAVar4,&(qi->super_Expression).super_Statement.super_ASTObject.context,
                          pEVar11);
          goto LAB_0023e771;
        }
        goto LAB_0023e727;
      }
      if ((this->currentConnectionEndpoint).object == (SharedEndpoint *)0x0) {
        pAVar4 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator;
        pPVar8 = pool_ptr<soul::AST::ProcessorBase>::operator*
                           ((pool_ptr<soul::AST::ProcessorBase> *)&specialisationArgs);
        qi = (QualifiedIdentifier *)
             PoolAllocator::
             allocate<soul::AST::ProcessorRef,soul::AST::Context&,soul::AST::ProcessorBase&>
                       (&pAVar4->pool,
                        &(qi->super_Expression).super_Statement.super_ASTObject.context,pPVar8);
        goto LAB_0023e771;
      }
      local_258.object =
           (((this_00->
             super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
             )._M_impl.super__Vector_impl_data._M_start)->specialisationArgs).object;
      AST::CommaSeparatedList::getAsExpressionList
                ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)&s,&local_258
                );
      pPVar8 = pool_ptr<soul::AST::ProcessorBase>::operator->
                         ((pool_ptr<soul::AST::ProcessorBase> *)&specialisationArgs);
      bVar5 = ModuleInstanceResolver::validateSpecialisationArgs
                        (&this->super_ModuleInstanceResolver,(ArgList *)&s,
                         &(pPVar8->super_ModuleBase).specialisationParams,false);
      if (bVar5) {
        pPVar8 = pool_ptr<soul::AST::ProcessorBase>::operator*
                           ((pool_ptr<soul::AST::ProcessorBase> *)&specialisationArgs);
        local_260.object = (Expression *)0x0;
        qi = (QualifiedIdentifier *)
             getOrCreateImplicitProcessorInstance
                       (this,&(qi->super_Expression).super_Statement.super_ASTObject.context,pPVar8,
                        &local_260);
      }
      this_03 = (ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)&s;
    }
    else {
      local_298.object = pAVar3;
      cast<soul::AST::Namespace,soul::AST::ASTObject>((soul *)&targetNamespace,&local_298);
      if (targetNamespace.object == (Namespace *)0x0) goto LAB_0023e727;
      local_2a0.object =
           (((this_00->
             super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
             )._M_impl.super__Vector_impl_data._M_start)->specialisationArgs).object;
      AST::CommaSeparatedList::getAsExpressionList(&specialisationArgs,&local_2a0);
      pNVar6 = pool_ptr<soul::AST::Namespace>::operator->(&targetNamespace);
      bVar5 = ModuleInstanceResolver::validateSpecialisationArgs
                        (&this->super_ModuleInstanceResolver,&specialisationArgs,
                         &(pNVar6->super_ModuleBase).specialisationParams,false);
      if (!bVar5) {
        pNVar6 = pool_ptr<soul::AST::Namespace>::operator->(&targetNamespace);
        (*(pNVar6->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&s,pNVar6);
        Errors::wrongNumArgsForNamespace<soul::IdentifierPath>(&local_d8,(IdentifierPath *)&s);
        AST::Context::throwError
                  (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_d8,false);
      }
      pNVar6 = pool_ptr<soul::AST::Namespace>::operator->(&targetNamespace);
      bVar5 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                        (&this->super_ModuleInstanceResolver,&specialisationArgs,
                         &(pNVar6->super_ModuleBase).specialisationParams);
      if (!bVar5) goto LAB_0023e71d;
      pNVar6 = pool_ptr<soul::AST::Namespace>::operator*(&targetNamespace);
      pNVar6 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                         (&this->super_ModuleInstanceResolver,pNVar6,&specialisationArgs);
      updateQualifiedIdentifierPrefix(this,qi,pNVar6);
      std::
      vector<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
      ::erase(this_00,(this_00->
                      super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                      )._M_impl.super__Vector_impl_data._M_start);
LAB_0023e70d:
      psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                super_RewritingASTVisitor.itemsReplaced;
      *psVar1 = *psVar1 + 1;
      this_03 = &specialisationArgs;
    }
    ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear(this_03);
  }
  else {
    if (local_208.itemsFound.numActive == 0) {
      AST::QualifiedIdentifier::getPath((IdentifierPath *)&s,qi);
      ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&s);
      if (((ResolutionPass *)0x1 < local_350) &&
         (findParameterisedNamespace
                    ((QualifiedIdentifierResolver *)&targetNamespace,(QualifiedIdentifier *)this,
                     (int *)qi), targetNamespace.object != (Namespace *)0x0)) {
        local_230.object =
             (((qi->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->specialisationArgs).object;
        AST::CommaSeparatedList::getAsExpressionList(&specialisationArgs,&local_230);
        pNVar6 = pool_ptr<soul::AST::Namespace>::operator->(&targetNamespace);
        bVar5 = ModuleInstanceResolver::validateSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,&specialisationArgs,
                           &(pNVar6->super_ModuleBase).specialisationParams,false);
        if (!bVar5) {
          pNVar6 = pool_ptr<soul::AST::Namespace>::operator->(&targetNamespace);
          (*(pNVar6->super_ModuleBase).super_ASTObject._vptr_ASTObject[0xe])(&s,pNVar6);
          Errors::wrongNumArgsForNamespace<soul::IdentifierPath>(&local_68,(IdentifierPath *)&s);
          AST::Context::throwError
                    (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_68,false
                    );
        }
        pNVar6 = pool_ptr<soul::AST::Namespace>::operator->(&targetNamespace);
        bVar5 = ModuleInstanceResolver::canResolveAllSpecialisationArgs
                          (&this->super_ModuleInstanceResolver,&specialisationArgs,
                           &(pNVar6->super_ModuleBase).specialisationParams);
        if (bVar5) {
          pNVar6 = pool_ptr<soul::AST::Namespace>::operator*(&targetNamespace);
          pNVar6 = ModuleInstanceResolver::getOrAddNamespaceSpecialisation
                             (&this->super_ModuleInstanceResolver,pNVar6,&specialisationArgs);
          updateQualifiedIdentifierPrefix(this,qi,pNVar6);
          pPVar2 = (qi->pathSections).
                   super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          IdentifierPath::removeFirst
                    (&pPVar2->path,(long)(int)(pPVar2->path).pathSections.numActive);
          goto LAB_0023e70d;
        }
LAB_0023e71d:
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::clear
                  (&specialisationArgs);
      }
    }
LAB_0023e727:
    getBuiltInConstant((QualifiedIdentifierResolver *)&s,(QualifiedIdentifier *)this);
    if (s.object == (StructDeclaration *)0x0) {
      ASTUtilities::createConsoleEndpoint
                ((ASTUtilities *)&s,
                 (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                 allocator,qi);
      if (s.object == (StructDeclaration *)0x0) {
        if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors
            == true) {
          psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                    numFails;
          *psVar1 = *psVar1 + 1;
        }
        else {
          AST::QualifiedIdentifier::getPath((IdentifierPath *)&s,qi);
          bVar5 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&s,"wrap");
          if (bVar5) {
            ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                      ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&s);
          }
          else {
            AST::QualifiedIdentifier::getPath((IdentifierPath *)&specialisationArgs,qi);
            bVar5 = IdentifierPath::isUnqualifiedName((IdentifierPath *)&specialisationArgs,"clamp")
            ;
            ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                      ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&specialisationArgs);
            ArrayWithPreallocation<soul::Identifier,_8UL>::clear
                      ((ArrayWithPreallocation<soul::Identifier,_8UL> *)&s);
            if (!bVar5) {
              this_01 = &(qi->super_Expression).super_Statement.super_ASTObject.context;
              if (local_208.itemsFound.numActive < 2) {
                AST::QualifiedIdentifier::getPath((IdentifierPath *)&s,qi);
                Errors::unresolvedSymbol<soul::IdentifierPath>(&local_148,(IdentifierPath *)&s);
                AST::Context::throwError(this_01,&local_148,false);
              }
              AST::QualifiedIdentifier::getPath((IdentifierPath *)&s,qi);
              Errors::ambiguousSymbol<soul::IdentifierPath>(&local_110,(IdentifierPath *)&s);
              AST::Context::throwError(this_01,&local_110,false);
            }
          }
        }
      }
      else {
        qi = (QualifiedIdentifier *)
             pool_ptr<soul::AST::OutputEndpointRef>::operator*
                       ((pool_ptr<soul::AST::OutputEndpointRef> *)&s);
      }
    }
    else {
      qi = (QualifiedIdentifier *)
           pool_ptr<soul::AST::Constant>::operator*((pool_ptr<soul::AST::Constant> *)&s);
    }
  }
LAB_0023e771:
  AST::Scope::NameSearch::~NameSearch(&local_208);
  std::__cxx11::string::~string((string *)&path);
  return &qi->super_Expression;
}

Assistant:

AST::Expression& visit (AST::QualifiedIdentifier& qi) override
        {
            super::visit (qi);

            auto path = qi.getPath().toString();

            AST::Scope::NameSearch search;
            search.partiallyQualifiedPath = qi.getPath();
            search.stopAtFirstScopeWithResults = true;
            search.findVariables = true;
            search.findTypes = true;
            search.findFunctions = false;
            search.findNamespaces = true;
            search.findProcessors = true;
            search.findProcessorInstances = (parsingProcessorInstance == 0);
            search.findEndpoints = true;

            if (auto scope = qi.getParentScope())
                scope->performFullNameSearch (search, currentStatement.get());

            if (search.itemsFound.size() == 0)
            {
                if (qi.getPath().isQualified())
                {
                    int itemsRemoved = 0;
                    auto targetNamespace = findParameterisedNamespace (qi, itemsRemoved);

                    if (targetNamespace != nullptr)
                    {
                        auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                        if (! validateSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams, false))
                            qi.context.throwError (Errors::wrongNumArgsForNamespace (targetNamespace->getFullyQualifiedDisplayPath()));

                        if (canResolveAllSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams))
                        {
                            auto& resolvedNamespace = getOrAddNamespaceSpecialisation (*targetNamespace, specialisationArgs);
                            updateQualifiedIdentifierPrefix (qi, resolvedNamespace);
                            auto itemsToRemove = static_cast<size_t> (static_cast<int> (qi.pathSections[0].path.size()) - itemsRemoved);
                            qi.pathSections[0].path.removeFirst (itemsToRemove);
                            ++itemsReplaced;
                            return qi;
                        }
                    }
                }
            }
            else if (search.itemsFound.size() == 1)
            {
                auto item = search.itemsFound.front();

                if (qi.isSimplePath())
                {
                    if (auto s = cast<AST::StructDeclaration> (item))
                        return allocator.allocate<AST::StructDeclarationRef> (qi.context, *s);

                    if (auto e = cast<AST::Expression> (item))
                        return *e;

                    if (auto v = cast<AST::VariableDeclaration> (item))
                    {
                        ++numVariablesResolved;
                        return allocator.allocate<AST::VariableRef> (qi.context, *v);
                    }

                    if (auto p = cast<AST::ProcessorBase> (item))
                    {
                        if (currentConnectionEndpoint != nullptr)
                        {
                            auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                            if (! validateSpecialisationArgs (specialisationArgs, p->specialisationParams, false))
                                return qi;

                            return getOrCreateImplicitProcessorInstance (qi.context, *p, {});
                        }

                        return allocator.allocate<AST::ProcessorRef> (qi.context, *p);
                    }

                    if (auto n = cast<AST::Namespace> (item))
                        return allocator.allocate<AST::NamespaceRef> (qi.context, *n);

                    if (auto na = cast<AST::NamespaceAliasDeclaration> (item))
                    {
                        if (na->isResolved())
                            return allocator.allocate<AST::NamespaceRef> (qi.context, *na->resolvedNamespace);

                        if (na->targetNamespace == &qi)
                            qi.context.throwError (Errors::circularNamespaceAlias (qi.getPath()));
                    }

                    if (auto p = cast<AST::ProcessorInstance> (item))
                        return allocator.allocate<AST::ProcessorInstanceRef> (qi.context, *p);

                    if (auto pa = cast<AST::ProcessorAliasDeclaration> (item))
                    {
                        if (pa->isResolved())
                        {
                            if (currentConnectionEndpoint != nullptr)
                                return getOrCreateImplicitProcessorInstance (qi.context, *pa->resolvedProcessor, {});

                            return allocator.allocate<AST::ProcessorRef> (qi.context, *pa->resolvedProcessor);
                        }
                    }

                    if (auto e = cast<AST::EndpointDeclaration> (item))
                        if (! e->isUnresolvedChildReference())
                            return ASTUtilities::createEndpointRef (allocator, qi.context, *e);
                }
                else
                {
                    if (auto targetNamespace = cast<AST::Namespace> (item))
                    {
                        auto specialisationArgs = AST::CommaSeparatedList::getAsExpressionList (qi.pathSections[0].specialisationArgs);

                        if (! validateSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams, false))
                            qi.context.throwError (Errors::wrongNumArgsForNamespace (targetNamespace->getFullyQualifiedDisplayPath()));

                        if (canResolveAllSpecialisationArgs (specialisationArgs, targetNamespace->specialisationParams))
                        {
                            auto& resolvedNamespace = getOrAddNamespaceSpecialisation (*targetNamespace, specialisationArgs);
                            updateQualifiedIdentifierPrefix (qi, resolvedNamespace);

                            qi.pathSections.erase (qi.pathSections.begin());
                            ++itemsReplaced;
                            return qi;
                        }

                    }
                }
            }


            if (auto builtInConstant = getBuiltInConstant (qi))
                return *builtInConstant;

            if (auto consoleEndpoint = ASTUtilities::createConsoleEndpoint (allocator, qi))
                return *consoleEndpoint;

            if (ignoreErrors)
            {
                ++numFails;
            }
            else
            {
                if (qi.getPath().isUnqualifiedName ("wrap") || qi.getPath().isUnqualifiedName ("clamp"))
                    return qi;

                if (search.itemsFound.size() > 1)
                    qi.context.throwError (Errors::ambiguousSymbol (qi.getPath()));

                qi.context.throwError (Errors::unresolvedSymbol (qi.getPath()));
            }

            return qi;
        }